

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::MixedAssignmentVisitor::check_var_parent
               (Generator *generator,Var *dst_var,Var *var,Stmt *stmt)

{
  Var *pVVar1;
  bool bVar2;
  int iVar3;
  VarType VVar4;
  int iVar5;
  undefined4 extraout_var;
  Generator *pGVar7;
  undefined4 extraout_var_00;
  long *plVar8;
  long lVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar10;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  string local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Generator *local_a8;
  Generator *pGStack_a0;
  Var *local_98;
  Var *pVStack_90;
  Stmt *local_88;
  size_type sStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_60;
  Stmt *local_48;
  Var *local_40;
  allocator_type local_31;
  Generator *pGVar6;
  
  iVar3 = (*(var->super_IRNode)._vptr_IRNode[0xd])(var);
  pGVar6 = (Generator *)CONCAT44(extraout_var,iVar3);
  pGVar7 = Const::const_gen();
  if (pGVar6 != pGVar7) {
    if ((var->type_ == ConstValue) &&
       (iVar3 = (*(var->super_IRNode)._vptr_IRNode[0xd])(var),
       (Generator *)CONCAT44(extraout_var_00,iVar3) != generator)) {
      var->generator_ = pGVar6;
      return;
    }
    if (pGVar6 == generator) {
      return;
    }
    VVar4 = dst_var->type_;
    if (VVar4 == Slice) {
      plVar8 = (long *)__dynamic_cast(dst_var,&Var::typeinfo,&VarSlice::typeinfo,0);
      dst_var = (Var *)(**(code **)(*plVar8 + 0x148))(plVar8);
      VVar4 = dst_var->type_;
    }
    if ((VVar4 == PortIO) &&
       (lVar9 = __dynamic_cast(dst_var,&Var::typeinfo,&Port::typeinfo,0),
       *(int *)(lVar9 + 0x270) == 0)) {
      iVar3 = (*(dst_var->super_IRNode)._vptr_IRNode[0xd])(dst_var);
      pGVar7 = (Generator *)
               (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x20))
                         ((long *)CONCAT44(extraout_var_04,iVar3));
      if (pGVar6 == pGVar7) {
        return;
      }
      iVar3 = (*(pGVar6->super_IRNode)._vptr_IRNode[4])(pGVar6);
      if ((Generator *)CONCAT44(extraout_var_05,iVar3) == pGVar7) {
        return;
      }
      iVar3 = (*(pGVar6->super_IRNode)._vptr_IRNode[4])(pGVar6);
      if ((Generator *)CONCAT44(extraout_var_06,iVar3) == pGVar7) {
        return;
      }
      local_40 = (Var *)__cxa_allocate_exception(0x10);
      (*(dst_var->super_IRNode)._vptr_IRNode[0x1f])(&local_e8,dst_var);
      (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_c8,var);
      local_a8 = (Generator *)(generator->instance_name)._M_dataplus._M_p;
      pGStack_a0 = (Generator *)(generator->instance_name)._M_string_length;
      local_88 = (Stmt *)(pGVar6->instance_name)._M_dataplus._M_p;
      sStack_80 = (pGVar6->instance_name)._M_string_length;
      local_98 = (Var *)local_e8;
      pVStack_90 = (Var *)uStack_e0;
      local_78 = local_c8;
      uStack_70 = uStack_c0;
      bVar10 = fmt::v7::to_string_view<char,_0>
                         (
                         "{0}.{1} cannot be wired to {2}.{3} because {0} is not a child generator of {2}"
                         );
      format_str.data_ = (char *)bVar10.size_;
      format_str.size_ = 0xdddd;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_a8;
      fmt::v7::detail::vformat_abi_cxx11_(&local_108,(detail *)bVar10.data_,format_str,args);
      __l._M_len = 4;
      __l._M_array = (iterator)&local_a8;
      local_a8 = generator;
      pGStack_a0 = pGVar6;
      local_98 = dst_var;
      pVStack_90 = var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_60,__l,&local_31);
      pVVar1 = local_40;
      VarException::VarException((VarException *)local_40,&local_108,&local_60);
      __cxa_throw(pVVar1,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = (*(pGVar6->super_IRNode)._vptr_IRNode[4])(pGVar6);
    if ((Generator *)CONCAT44(extraout_var_01,iVar3) != generator) {
      iVar3 = (*(pGVar6->super_IRNode)._vptr_IRNode[4])(pGVar6);
      local_40 = dst_var;
      iVar5 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
      dst_var = local_40;
      if (CONCAT44(extraout_var_02,iVar3) != CONCAT44(extraout_var_03,iVar5)) goto LAB_001fa46c;
    }
    bVar2 = has_non_port(generator,var);
    if (bVar2) {
LAB_001fa46c:
      local_48 = stmt;
      local_40 = (Var *)__cxa_allocate_exception(0x10);
      (*(dst_var->super_IRNode)._vptr_IRNode[0x1f])(&local_e8,dst_var);
      (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_c8,var);
      local_a8 = (Generator *)(generator->instance_name)._M_dataplus._M_p;
      pGStack_a0 = (Generator *)(generator->instance_name)._M_string_length;
      local_88 = (Stmt *)(pGVar6->instance_name)._M_dataplus._M_p;
      sStack_80 = (pGVar6->instance_name)._M_string_length;
      local_98 = (Var *)local_e8;
      pVStack_90 = (Var *)uStack_e0;
      local_78 = local_c8;
      uStack_70 = uStack_c0;
      bVar10 = fmt::v7::to_string_view<char,_0>
                         (
                         "{0}.{1} cannot be wired to {2}.{3} because {2} is not a child generator of {0}"
                         );
      format_str_00.data_ = (char *)bVar10.size_;
      format_str_00.size_ = 0xdddd;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_a8;
      fmt::v7::detail::vformat_abi_cxx11_(&local_108,(detail *)bVar10.data_,format_str_00,args_00);
      local_88 = local_48;
      __l_00._M_len = 5;
      __l_00._M_array = (iterator)&local_a8;
      local_a8 = generator;
      pGStack_a0 = pGVar6;
      local_98 = dst_var;
      pVStack_90 = var;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_60,__l_00,&local_31);
      pVVar1 = local_40;
      VarException::VarException((VarException *)local_40,&local_108,&local_60);
      __cxa_throw(pVVar1,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

static void check_var_parent(Generator* generator, Var* dst_var, Var* var, Stmt* stmt) {
        auto* gen = var->generator();
        if (gen == Const::const_gen()) return;
        if (var->type() == VarType::ConstValue && var->generator() != generator) {
            var->set_generator(gen);
            return;
        }
        if (generator != gen) {
            // if it's an input port, the parent context is different
            if (dst_var->type() == VarType::Slice) {
                auto* slice = dynamic_cast<VarSlice*>(dst_var);
                dst_var = const_cast<Var*>(slice->get_var_root_parent());
            }
            if (dst_var->type() == VarType::PortIO) {
                auto* port = dynamic_cast<Port*>(dst_var);
                if (port->port_direction() == PortDirection::In) {
                    auto* context_g = dst_var->generator()->parent();
                    if (gen != context_g && gen->parent() != context_g &&
                        gen->parent() != context_g) {
                        throw VarException(
                            ::format("{0}.{1} cannot be wired to {2}.{3} because {0} is "
                                     "not a child generator of {2}",
                                     generator->instance_name, dst_var->to_string(),
                                     gen->instance_name, var->to_string()),
                            {generator, gen, dst_var, var});
                    }
                    return;
                }
            }
            if ((gen->parent() != generator && gen->parent() != generator->parent()) ||
                has_non_port(generator, var)) {
                throw VarException(::format("{0}.{1} cannot be wired to {2}.{3} because {2} is "
                                            "not a child generator of {0}",
                                            generator->instance_name, dst_var->to_string(),
                                            gen->instance_name, var->to_string()),
                                   {generator, gen, dst_var, var, stmt});
            }
        }
    }